

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O0

void __thiscall
mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
          (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *this,LinTerms *le,AlgConRhs<_1> rr
          ,bool fSort)

{
  byte in_DL;
  LinTerms *in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  LinTerms *in_stack_ffffffffffffffb8;
  
  BasicConstraint::BasicConstraint((BasicConstraint *)0x194860);
  LinTerms::LinTerms(in_RSI,in_stack_ffffffffffffffb8);
  *(undefined8 *)(in_RDI + 0x98) = in_XMM0_Qa;
  if ((in_DL & 1) != 0) {
    sort_terms((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)0x194895);
  }
  return;
}

Assistant:

AlgebraicConstraint(Body le, RhsOrRange rr, bool fSort=true)
    : Body(std::move(le)), RhsOrRange(std::move(rr))
  { if (fSort) sort_terms(); }